

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

TransSetSyntax * __thiscall slang::parsing::Parser::parseTransSet(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  TransRangeSyntax *pTVar4;
  undefined4 extraout_var;
  TransSetSyntax *pTVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  TokenKind TVar6;
  Token TVar7;
  Token closeParen;
  Token openParen;
  Token local_210;
  Token local_200;
  Token local_1f0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1e0;
  undefined1 local_1d0;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  Token::Token(&local_1f0);
  Token::Token(&local_210);
  local_1f0 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if (((undefined1  [16])local_1f0 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    SVar3 = Token::location(&local_1f0);
    local_210 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    auStack_1b0._8_8_ = (Info *)0x0;
    auStack_1b0._16_8_ = (pointer)0x0;
    goto LAB_003bcb84;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_200 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfTransSet(local_200.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_200);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
    local_210 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_003bc9ca:
    src = local_210.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleTransSet(local_200.kind);
    if (bVar1) {
      do {
        pTVar4 = parseTransRange(this);
        local_1e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar4;
        local_1d0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1e0._M_first);
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar7.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfTransSet(TVar6);
        iVar2 = 3;
        src = extraout_RDX;
        if (TVar6 != EndOfFile && !bVar1) {
          if (TVar6 != EqualsArrow) {
            ParserBase::expect(&this->super_ParserBase,EqualsArrow);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTransSet,&slang::syntax::SyntaxFacts::isEndOfTransSet>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_210 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                src = local_210.info;
                iVar2 = 1;
                goto LAB_003bcb1c;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,EqualsArrow);
            } while (!bVar1);
          }
          local_1e0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,EqualsArrow);
          local_1d0 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_1e0._M_first);
          TVar7 = ParserBase::peek(&this->super_ParserBase);
          TVar6 = TVar7.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfTransSet(TVar6);
          if (TVar6 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if ((local_200.kind == TVar6) && (local_200.info == TVar7.info)) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTransSet,&slang::syntax::SyntaxFacts::isEndOfTransSet>
                                (&this->super_ParserBase,(DiagCode)0x10001,true);
              src = extraout_RDX_02;
              if (!bVar1) goto LAB_003bcb1c;
            }
            iVar2 = 0;
            local_200 = TVar7;
          }
        }
LAB_003bcb1c:
      } while (iVar2 == 0);
      if (iVar2 == 3) {
        local_210 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        goto LAB_003bc9ca;
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_200,CloseParenthesis,&local_210,(DiagCode)0x10001);
      src = extraout_RDX_03;
    }
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  auStack_1b0._8_8_ = extraout_RDX_04;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_003bcb84:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_005d6a38;
  local_198._M_extent_value = auStack_1b0._8_8_;
  pTVar5 = slang::syntax::SyntaxFactory::transSet
                     (&this->factory,local_1f0,
                      (SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *)local_1c8,local_210);
  return pTVar5;
}

Assistant:

TransSetSyntax& Parser::parseTransSet() {
    Token openParen;
    Token closeParen;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleTransSet, isEndOfTransSet>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::EqualsArrow, openParen,
        list, closeParen, RequireItems::True, diag::ExpectedExpression,
        [this] { return &parseTransRange(); });

    return factory.transSet(openParen, list, closeParen);
}